

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_descriptor.c
# Opt level: O2

int main(void)

{
  uint32_t *puVar1;
  undefined8 uVar2;
  ulong uVar3;
  char *__s1;
  undefined8 __s2;
  _Bool _Var4;
  uint uVar5;
  int iVar6;
  uint uVar7;
  size_t sVar8;
  char *pcVar9;
  ulong uVar10;
  char *pcVar11;
  char *pcVar12;
  uint32_t derive_child_num;
  char **in_R8;
  size_t in_R9;
  byte bVar13;
  long lVar14;
  uint32_t in_stack_fffffffffffffd88;
  char *hex;
  size_t written;
  uint local_25c;
  wally_descriptor_address_list_test *local_258;
  char *local_250;
  long local_248;
  ulong local_240;
  uchar script [520];
  
  bVar13 = 1;
  for (lVar14 = 0; lVar14 != 0x1d0; lVar14 = lVar14 + 0x10) {
    pcVar12 = *(char **)((long)&g_miniscript_ref_test_table[0].miniscript + lVar14);
    _Var4 = check_parse_miniscript
                      (pcVar12,pcVar12,
                       *(char **)((long)&g_miniscript_ref_test_table[0].scriptpubkey + lVar14),
                       (char **)0x0,in_R8,in_R9,in_stack_fffffffffffffd88);
    if (!_Var4) {
      bVar13 = 0;
      printf("[%s] test failed!\n",
             *(undefined8 *)((long)&g_miniscript_ref_test_table[0].miniscript + lVar14));
    }
  }
  for (lVar14 = 0; lVar14 != 600; lVar14 = lVar14 + 0x28) {
    _Var4 = check_parse_miniscript
                      (*(char **)((long)&g_miniscript_test_table[0].name + lVar14),
                       *(char **)((long)&g_miniscript_test_table[0].descriptor + lVar14),
                       *(char **)((long)&g_miniscript_test_table[0].scriptpubkey + lVar14),
                       (char **)0x0,in_R8,in_R9,in_stack_fffffffffffffd88);
    if (!_Var4) {
      bVar13 = 0;
      printf("[%s] test failed!\n",*(undefined8 *)((long)&g_miniscript_test_table[0].name + lVar14))
      ;
    }
  }
  for (lVar14 = 0; lVar14 != 0x48; lVar14 = lVar14 + 0x18) {
    pcVar12 = *(char **)((long)&g_miniscript_taproot_test_table[0].miniscript + lVar14);
    _Var4 = check_parse_miniscript
                      (pcVar12,pcVar12,
                       *(char **)((long)&g_miniscript_taproot_test_table[0].scriptpubkey + lVar14),
                       (char **)(ulong)*(uint *)((long)&g_miniscript_taproot_test_table[0].flags +
                                                lVar14),in_R8,in_R9,in_stack_fffffffffffffd88);
    if (!_Var4) {
      bVar13 = 0;
      printf("[%s] test failed!\n",
             *(undefined8 *)((long)&g_miniscript_taproot_test_table[0].miniscript + lVar14));
    }
  }
  for (lVar14 = 0; lVar14 != 0x4d8; lVar14 = lVar14 + 0x28) {
    local_258 = *(wally_descriptor_address_list_test **)
                 ((long)&g_descriptor_test_table[0].name + lVar14);
    pcVar12 = *(char **)((long)&g_descriptor_test_table[0].descriptor + lVar14);
    pcVar9 = *(char **)((long)&g_descriptor_test_table[0].scriptpubkey + lVar14);
    puVar1 = *(uint32_t **)((long)&g_descriptor_test_table[0].bip32_index + lVar14);
    written = 0;
    pcVar11 = *(char **)((long)&g_descriptor_test_table[0].checksum + lVar14);
    hex = (char *)0x0;
    local_250 = (char *)0x0;
    if (puVar1 == (uint32_t *)0x0) {
      derive_child_num = 0;
    }
    else {
      derive_child_num = *puVar1;
    }
    uVar5 = wally_descriptor_to_scriptpubkey
                      (pcVar12,g_miniscript_keyname_list,g_miniscript_keyvalue_list,0xb,
                       derive_child_num,0,0,0,0,script,0x208,&written);
    if (uVar5 == 0) {
      uVar5 = wally_hex_from_bytes(script,written,&hex);
      if (uVar5 != 0) {
        printf("wally_hex_from_bytes NG[%d]\n",(ulong)uVar5);
        goto LAB_0010544d;
      }
      uVar5 = wally_descriptor_create_checksum
                        (pcVar12,g_miniscript_keyname_list,g_miniscript_keyvalue_list,0xb,0,
                         &local_250);
      __s1 = hex;
      if (uVar5 != 0) {
        printf("wally_descriptor_create_checksum NG[%d]\n",(ulong)uVar5);
        wally_free_string(hex);
        goto LAB_0010544d;
      }
      sVar8 = strlen(hex);
      iVar6 = strncmp(__s1,pcVar9,sVar8 + 1);
      pcVar9 = local_250;
      if (iVar6 != 0) {
        pcVar11 = "%s:\n  Input: %s\n  Output: %s\n";
        pcVar9 = __s1;
LAB_001054c7:
        printf(pcVar11,local_258,pcVar12,pcVar9);
        wally_free_string(local_250);
        wally_free_string(hex);
        goto LAB_0010544d;
      }
      iVar6 = strncmp(local_250,pcVar11,9);
      if (iVar6 != 0) {
        pcVar11 = "%s:\n  Input: %s\n  Checksum: %s\n";
        goto LAB_001054c7;
      }
      wally_free_string(pcVar9);
      wally_free_string(hex);
    }
    else {
      printf("wally_descriptor_to_scriptpubkey NG[%d]\n",(ulong)uVar5);
LAB_0010544d:
      bVar13 = 0;
      printf("[%s] test failed!\n",*(undefined8 *)((long)&g_descriptor_test_table[0].name + lVar14))
      ;
    }
  }
  for (lVar14 = 0; lVar14 != 0xe0; lVar14 = lVar14 + 0x20) {
    uVar2 = *(undefined8 *)((long)&g_descriptor_depth_test_table[0].name + lVar14);
    pcVar12 = *(char **)((long)&g_descriptor_depth_test_table[0].descriptor + lVar14);
    written = 0;
    pcVar9 = *(char **)((long)&g_descriptor_depth_test_table[0].scriptpubkey + lVar14);
    hex = (char *)0x0;
    uVar5 = wally_descriptor_to_scriptpubkey
                      (pcVar12,g_miniscript_keyname_list,g_miniscript_keyvalue_list,0xb,0,0,
                       *(uint32_t *)((long)&g_descriptor_depth_test_table[0].depth + lVar14),
                       *(uint32_t *)((long)&g_descriptor_depth_test_table[0].index + lVar14),0,
                       script,0x208,&written);
    if (uVar5 == 0) {
      uVar5 = wally_hex_from_bytes(script,written,&hex);
      pcVar11 = hex;
      if (uVar5 != 0) {
        pcVar12 = "wally_hex_from_bytes NG[%d]\n";
        goto LAB_001055ab;
      }
      sVar8 = strlen(hex);
      iVar6 = strncmp(pcVar11,pcVar9,sVar8 + 1);
      if (iVar6 != 0) {
        printf("%s:\n  Input: %s\n  Output: %s\n",uVar2,pcVar12,pcVar11);
        wally_free_string(hex);
        goto LAB_001055b4;
      }
      wally_free_string(pcVar11);
    }
    else {
      pcVar12 = "wally_descriptor_to_scriptpubkey NG[%d]\n";
LAB_001055ab:
      printf(pcVar12,(ulong)uVar5);
LAB_001055b4:
      bVar13 = 0;
      printf("[%s] keylist test failed!\n",
             *(undefined8 *)((long)&g_descriptor_depth_test_table[0].name + lVar14));
    }
  }
  for (lVar14 = 0; lVar14 != 0x3c0; lVar14 = lVar14 + 0x20) {
    uVar2 = *(undefined8 *)((long)&g_descriptor_address_test_table[0].name + lVar14);
    pcVar12 = *(char **)((long)&g_descriptor_address_test_table[0].address + lVar14);
    script[0] = '\0';
    script[1] = '\0';
    script[2] = '\0';
    script[3] = '\0';
    script[4] = '\0';
    script[5] = '\0';
    script[6] = '\0';
    script[7] = '\0';
    uVar5 = wally_descriptor_to_address
                      (*(char **)((long)&g_descriptor_address_test_table[0].descriptor + lVar14),
                       g_miniscript_keyname_list,g_miniscript_keyvalue_list,0xb,
                       *(uint32_t *)((long)&g_descriptor_address_test_table[0].bip32_index + lVar14)
                       ,*(uint32_t *)((long)&g_descriptor_address_test_table[0].network + lVar14),0,
                       (char **)script);
    __s2 = script._0_8_;
    if (uVar5 == 0) {
      sVar8 = strlen(pcVar12);
      iVar6 = strncmp(pcVar12,(char *)__s2,sVar8 + 1);
      if (iVar6 != 0) {
        printf("%s:\n  Address: %s\n  Expect: %s\n",uVar2,__s2,pcVar12);
        wally_free_string((char *)script._0_8_);
        goto LAB_001056e1;
      }
      wally_free_string((char *)__s2);
    }
    else {
      printf("wally_descriptor_to_address NG[%d]\n",(ulong)uVar5);
LAB_001056e1:
      bVar13 = 0;
      printf("[%s] test failed!\n",
             *(undefined8 *)((long)&g_descriptor_address_test_table[0].name + lVar14));
    }
  }
  lVar14 = 0;
  do {
    if (lVar14 == 2) {
      for (lVar14 = 0; lVar14 != 0x1b0; lVar14 = lVar14 + 0x18) {
        uVar2 = *(undefined8 *)((long)&g_descriptor_err_test_table[0].name + lVar14);
        written = 0;
        uVar5 = wally_descriptor_to_scriptpubkey
                          (*(char **)((long)&g_descriptor_err_test_table[0].descriptor + lVar14),
                           g_miniscript_keyname_list,g_miniscript_keyvalue_list,0xb,0,
                           *(uint32_t *)((long)&g_descriptor_err_test_table[0].network + lVar14),0,0
                           ,0,script,0x208,&written);
        if (uVar5 != 0xfffffffe) {
          if (uVar5 == 0) {
            printf("wally_descriptor_to_scriptpubkey Fail[Not Error] name[%s]\n",uVar2);
          }
          else {
            printf("wally_descriptor_to_scriptpubkey NG[%d]\n",(ulong)uVar5);
          }
          bVar13 = 0;
          printf("[%s] test failed!\n",
                 *(undefined8 *)((long)&g_descriptor_err_test_table[0].name + lVar14));
        }
      }
      for (lVar14 = 0; lVar14 != 0x78; lVar14 = lVar14 + 0x18) {
        uVar2 = *(undefined8 *)((long)&g_address_err_test_table[0].name + lVar14);
        script[0] = '\0';
        script[1] = '\0';
        script[2] = '\0';
        script[3] = '\0';
        script[4] = '\0';
        script[5] = '\0';
        script[6] = '\0';
        script[7] = '\0';
        uVar5 = wally_descriptor_to_address
                          (*(char **)((long)&g_address_err_test_table[0].descriptor + lVar14),
                           g_miniscript_keyname_list,g_miniscript_keyvalue_list,0xb,0,
                           *(uint32_t *)((long)&g_address_err_test_table[0].network + lVar14),0,
                           (char **)script);
        if (uVar5 != 0xfffffffe) {
          if (uVar5 == 0) {
            printf("wally_descriptor_to_address Fail[Not Error] name[%s]\n",uVar2);
            wally_free_string((char *)script._0_8_);
          }
          else {
            printf("wally_descriptor_to_address NG[%d]\n",(ulong)uVar5);
          }
          bVar13 = 0;
          printf("[%s] test failed!\n",
                 *(undefined8 *)((long)&g_address_err_test_table[0].name + lVar14));
        }
      }
      return (int)(~bVar13 & 1);
    }
    local_258 = g_descriptor_addresses_test_table + lVar14;
    pcVar12 = g_descriptor_addresses_test_table[lVar14].name;
    uVar5 = g_descriptor_addresses_test_table[lVar14].start_index;
    uVar3 = g_descriptor_addresses_test_table[lVar14].address_list_num;
    script[0] = '\0';
    script[1] = '\0';
    script[2] = '\0';
    script[3] = '\0';
    script[4] = '\0';
    script[5] = '\0';
    script[6] = '\0';
    script[7] = '\0';
    script[8] = '\0';
    script[9] = '\0';
    script[10] = '\0';
    script[0xb] = '\0';
    script[0xc] = '\0';
    script[0xd] = '\0';
    script[0xe] = '\0';
    script[0xf] = '\0';
    local_248 = lVar14;
    uVar7 = wally_descriptor_to_addresses
                      (g_descriptor_addresses_test_table[lVar14].descriptor,
                       g_miniscript_keyname_list,g_miniscript_keyvalue_list,0xb,uVar5,
                       g_descriptor_addresses_test_table[lVar14].end_index,
                       g_descriptor_addresses_test_table[lVar14].network,0,
                       (wally_descriptor_addresses *)script);
    if (uVar7 == 0) {
      local_240 = (ulong)uVar5;
      if (script._8_8_ == uVar3) {
        local_25c = 1;
        for (uVar5 = 0; uVar10 = (ulong)uVar5, uVar10 < uVar3; uVar5 = uVar5 + 1) {
          pcVar9 = local_258->address_list[uVar10];
          pcVar11 = *(char **)(script._0_8_ + 8 + uVar10 * 0x18);
          uVar7 = *(uint *)(script._0_8_ + uVar10 * 0x18);
          sVar8 = strlen(pcVar9);
          iVar6 = strncmp(pcVar9,pcVar11,sVar8 + 1);
          if (iVar6 != 0) {
            local_25c = 0;
            printf("%s:\n  Address[%u]: %s\n  Expect: %s\n",pcVar12,uVar10,pcVar11,pcVar9);
          }
          if ((int)local_240 + uVar5 != uVar7) {
            local_25c = 0;
            printf("%s:\n  childNum[%u]: %u\n  Expect: %u\n",pcVar12,uVar10,(ulong)uVar7);
          }
        }
        wally_free_descriptor_addresses((wally_descriptor_addresses *)script);
        if ((local_25c & 1) == 0) goto LAB_00105798;
      }
      else {
        printf("%s:\n  Address length: %zu\n  Expect: %zu\n",pcVar12,script._8_8_,uVar3);
        wally_free_descriptor_addresses((wally_descriptor_addresses *)script);
      }
    }
    else {
      printf("wally_descriptor_to_addresses NG[%d]\n",(ulong)uVar7);
LAB_00105798:
      bVar13 = 0;
      printf("[%s] test failed!\n",local_258->name);
    }
    lVar14 = local_248 + 1;
  } while( true );
}

Assistant:

int main(void)
{
    bool tests_ok = true;
    size_t index;
    size_t miniscript_ref_max = sizeof(g_miniscript_ref_test_table) / sizeof(struct wally_miniscript_ref_test);
    size_t miniscript_max = sizeof(g_miniscript_test_table) / sizeof(struct wally_miniscript_test);
    size_t miniscript_tr_max = sizeof(g_miniscript_taproot_test_table) / sizeof(struct wally_miniscript_taproot_test);
    size_t desc_max = sizeof(g_descriptor_test_table) / sizeof(struct wally_descriptor_test);
    size_t desc_depth_max = sizeof(g_descriptor_depth_test_table) / sizeof(struct wally_descriptor_depth_test);
    size_t addr_max = sizeof(g_descriptor_address_test_table) / sizeof(struct wally_descriptor_address_test);
    size_t addr_list_max = sizeof(g_descriptor_addresses_test_table) / sizeof(struct wally_descriptor_address_list_test);
    size_t desc_err_max = sizeof(g_descriptor_err_test_table) / sizeof(struct wally_descriptor_err_test);
    size_t addr_err_max = sizeof(g_address_err_test_table) / sizeof(struct wally_descriptor_err_test);

    for (index = 0; index < miniscript_ref_max; ++index) {
        if (!check_parse_miniscript(
                g_miniscript_ref_test_table[index].miniscript,
                g_miniscript_ref_test_table[index].miniscript,
                g_miniscript_ref_test_table[index].scriptpubkey,
                NULL, NULL, 0, 0)) {
            printf("[%s] test failed!\n", g_miniscript_ref_test_table[index].miniscript);
            tests_ok = false;
        }
    }

    for (index = 0; index < miniscript_max; ++index) {
        if (!check_parse_miniscript(
                g_miniscript_test_table[index].name,
                g_miniscript_test_table[index].descriptor,
                g_miniscript_test_table[index].scriptpubkey,
                NULL, NULL, 0, 0)) {
            printf("[%s] test failed!\n", g_miniscript_test_table[index].name);
            tests_ok = false;
        }
    }

    for (index = 0; index < miniscript_tr_max; ++index) {
        if (!check_parse_miniscript(
                g_miniscript_taproot_test_table[index].miniscript,
                g_miniscript_taproot_test_table[index].miniscript,
                g_miniscript_taproot_test_table[index].scriptpubkey,
                NULL, NULL, 0,
                g_miniscript_taproot_test_table[index].flags)) {
            printf("[%s] test failed!\n", g_miniscript_taproot_test_table[index].miniscript);
            tests_ok = false;
        }
    }

    for (index = 0; index < desc_max; ++index) {
        if (!check_descriptor_to_scriptpubkey(
                g_descriptor_test_table[index].name,
                g_descriptor_test_table[index].descriptor,
                g_descriptor_test_table[index].scriptpubkey,
                g_descriptor_test_table[index].bip32_index,
                g_descriptor_test_table[index].checksum)) {
            printf("[%s] test failed!\n", g_descriptor_test_table[index].name);
            tests_ok = false;
        }
    }

    for (index = 0; index < desc_depth_max; ++index) {
        if (!check_descriptor_to_scriptpubkey_depth(
                g_descriptor_depth_test_table[index].name,
                g_descriptor_depth_test_table[index].descriptor,
                g_descriptor_depth_test_table[index].depth,
                g_descriptor_depth_test_table[index].index,
                g_descriptor_depth_test_table[index].scriptpubkey)) {
            printf("[%s] keylist test failed!\n", g_descriptor_depth_test_table[index].name);
            tests_ok = false;
        }
    }

    for (index = 0; index < addr_max; ++index) {
        if (!check_descriptor_to_address(
                g_descriptor_address_test_table[index].name,
                g_descriptor_address_test_table[index].descriptor,
                g_descriptor_address_test_table[index].bip32_index,
                g_descriptor_address_test_table[index].network,
                g_descriptor_address_test_table[index].address)) {
            printf("[%s] test failed!\n", g_descriptor_address_test_table[index].name);
            tests_ok = false;
        }
    }

    for (index = 0; index < addr_list_max; ++index) {
        if (!check_descriptor_to_addresses(
                g_descriptor_addresses_test_table[index].name,
                g_descriptor_addresses_test_table[index].descriptor,
                g_descriptor_addresses_test_table[index].start_index,
                g_descriptor_addresses_test_table[index].end_index,
                g_descriptor_addresses_test_table[index].network,
                g_descriptor_addresses_test_table[index].address_list,
                g_descriptor_addresses_test_table[index].address_list_num)) {
            printf("[%s] test failed!\n", g_descriptor_addresses_test_table[index].name);
            tests_ok = false;
        }
    }

    for (index = 0; index < desc_err_max; ++index) {
        if (!check_descriptor_scriptpubkey_error(
                g_descriptor_err_test_table[index].name,
                g_descriptor_err_test_table[index].descriptor,
                g_descriptor_err_test_table[index].network)) {
            printf("[%s] test failed!\n", g_descriptor_err_test_table[index].name);
            tests_ok = false;
        }
    }

    for (index = 0; index < addr_err_max; ++index) {
        if (!check_descriptor_address_error(
                g_address_err_test_table[index].name,
                g_address_err_test_table[index].descriptor,
                g_address_err_test_table[index].network)) {
            printf("[%s] test failed!\n", g_address_err_test_table[index].name);
            tests_ok = false;
        }
    }

    return tests_ok ? 0 : 1;
}